

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CliffordLib.cpp
# Opt level: O2

Clifford * operator~(Clifford *__return_storage_ptr__,Clifford *A)

{
  uint tBase;
  int iVar1;
  pointer pBVar2;
  float local_34;
  Blade local_30;
  
  (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pBVar2 = (A->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  local_34 = 1.0;
  for (; pBVar2 != (A->super__Vector_base<Blade,_std::allocator<Blade>_>)._M_impl.
                   super__Vector_impl_data._M_finish; pBVar2 = pBVar2 + 1) {
    tBase = pBVar2->mBase;
    iVar1 = (int)(((ulong)((tBase - ((tBase >> 3 & 0x1111111) +
                                    (tBase >> 2 & 0x3333333) + (tBase >> 1 & 0x7777777))) +
                          (tBase - ((tBase >> 3 & 0x11111111) +
                                   (tBase >> 2 & 0x33333333) + (tBase >> 1 & 0x77777777)) >> 4)) &
                  0xffffffff0f0f0f0f) % 0xff);
    if (((iVar1 + -1) * iVar1 & 2U) != 0) {
      local_34 = -1.0;
    }
    Blade::Blade(&local_30,tBase,pBVar2->mVal * local_34);
    std::vector<Blade,_std::allocator<Blade>_>::emplace_back<Blade>
              (__return_storage_ptr__,&local_30);
    Blade::~Blade(&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

Clifford operator~(Clifford A)
{	float s=1;
	Clifford R;
	idx a=A.begin();
	while(a!=A.end())
	{	
		int r;
		r=bits(a->mBase);
		r=r*(r-1);
		if((r>>1)&1){s=-1;}
		R.push_back(Blade(a->mBase,s*a->mVal));
		a++;
	}
	return R;
}